

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

UniquePtr<BIGNUM> __thiscall
anon_unknown.dwarf_22460c::BIGNUMFileTest::GetBIGNUMImpl
          (BIGNUMFileTest *this,char *attribute,bool resize)

{
  FileTest *pFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *in;
  undefined8 uVar5;
  pointer bn;
  pointer pbVar6;
  byte in_CL;
  undefined7 in_register_00000011;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_88;
  UniquePtr<BIGNUM> ret;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string hex;
  bool resize_local;
  char *attribute_local;
  BIGNUMFileTest *this_local;
  
  hex.field_2._M_local_buf[0xf] = in_CL & 1;
  std::__cxx11::string::string((string *)local_48);
  pFVar1 = *(FileTest **)attribute;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,(char *)CONCAT71(in_register_00000011,resize),&local_69);
  bVar2 = FileTest::GetAttribute(pFVar1,(string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bignum_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    ret._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_4_ = 1;
    goto LAB_003b85eb;
  }
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_88);
  in = (char *)std::__cxx11::string::c_str();
  iVar3 = HexToBIGNUM((UniquePtr<BIGNUM> *)&local_88,in);
  iVar4 = std::__cxx11::string::size();
  if (iVar3 == iVar4) {
    if ((hex.field_2._M_local_buf[0xf] & 1U) != 0) {
      if ((*(uint *)(attribute + 8) & 1 << ((byte)*(undefined4 *)(attribute + 0xc) & 0x1f)) != 0) {
        bn = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_88);
        pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator->(&local_88);
        iVar3 = bn_resize_words(bn,(long)(pbVar6->width * 2 + 1));
        if (iVar3 == 0) {
          std::unique_ptr<bignum_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<bignum_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
          goto LAB_003b85e2;
        }
      }
      *(int *)(attribute + 0xc) = *(int *)(attribute + 0xc) + 1;
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)this,&local_88);
  }
  else {
    pFVar1 = *(FileTest **)attribute;
    uVar5 = std::__cxx11::string::c_str();
    FileTest::PrintLine(pFVar1,"Could not decode \'%s\'.",uVar5);
    std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bignum_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
  }
LAB_003b85e2:
  ret._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_4_ = 1;
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_88);
LAB_003b85eb:
  std::__cxx11::string::~string((string *)local_48);
  return (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

bssl::UniquePtr<BIGNUM> GetBIGNUMImpl(const char *attribute, bool resize) {
    std::string hex;
    if (!t_->GetAttribute(&hex, attribute)) {
      return nullptr;
    }

    bssl::UniquePtr<BIGNUM> ret;
    if (HexToBIGNUM(&ret, hex.c_str()) != static_cast<int>(hex.size())) {
      t_->PrintLine("Could not decode '%s'.", hex.c_str());
      return nullptr;
    }
    if (resize) {
      // Test with an oversized |BIGNUM| if necessary.
      if ((large_mask_ & (1 << num_bignums_)) &&
          !bn_resize_words(ret.get(), ret->width * 2 + 1)) {
        return nullptr;
      }
      num_bignums_++;
    }
    return ret;
  }